

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# argParserAdvancedConfiguration.cpp
# Opt level: O1

string * __thiscall
argParserAdvancedConfiguration::getAdditionalHelpFor
          (string *__return_storage_ptr__,argParserAdvancedConfiguration *this,string *command)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  long lVar3;
  int iVar4;
  argument *paVar5;
  long *plVar6;
  long *plVar7;
  size_type *psVar8;
  string help;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  long *local_f0;
  long local_e8;
  long local_e0;
  long lStack_d8;
  long *local_d0;
  long local_c8;
  long local_c0;
  long lStack_b8;
  long *local_b0;
  long local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  long local_88;
  long local_80;
  long lStack_78;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  string local_50;
  
  pcVar2 = (command->_M_dataplus)._M_p;
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_50,pcVar2,pcVar2 + command->_M_string_length);
  paVar5 = getArgument(this,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p);
  }
  if (paVar5 == (argument *)0x0) {
    std::operator+(&local_110,"no such command \"",command);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_110);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
  }
  else {
    local_110._M_dataplus._M_p = (pointer)&local_110.field_2;
    pcVar2 = (paVar5->additionalHelp)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_110,pcVar2,pcVar2 + (paVar5->additionalHelp)._M_string_length);
    std::operator+(&local_70,"\n additional help for \"",command);
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_70);
    local_f0 = &local_e0;
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_e0 = *plVar7;
      lStack_d8 = plVar6[3];
    }
    else {
      local_e0 = *plVar7;
      local_f0 = (long *)*plVar6;
    }
    local_e8 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_f0,(ulong)(paVar5->argShort)._M_dataplus._M_p);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_c0 = *plVar7;
      lStack_b8 = plVar6[3];
      local_d0 = &local_c0;
    }
    else {
      local_c0 = *plVar7;
      local_d0 = (long *)*plVar6;
    }
    local_c8 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_d0);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_a0 = *plVar7;
      lStack_98 = plVar6[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar7;
      local_b0 = (long *)*plVar6;
    }
    local_a8 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)(paVar5->argLong)._M_dataplus._M_p);
    plVar7 = plVar6 + 2;
    if ((long *)*plVar6 == plVar7) {
      local_80 = *plVar7;
      lStack_78 = plVar6[3];
      local_90 = &local_80;
    }
    else {
      local_80 = *plVar7;
      local_90 = (long *)*plVar6;
    }
    local_88 = plVar6[1];
    *plVar6 = (long)plVar7;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::append((char *)&local_90);
    paVar1 = &local_130.field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar6 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar8) {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130.field_2._8_8_ = plVar6[3];
      local_130._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_130.field_2._M_allocated_capacity = *psVar8;
      local_130._M_dataplus._M_p = (pointer)*plVar6;
    }
    local_130._M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    plVar6 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_130,(ulong)(paVar5->helpMessage)._M_dataplus._M_p);
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    psVar8 = (size_type *)(plVar6 + 2);
    if ((size_type *)*plVar6 == psVar8) {
      lVar3 = plVar6[3];
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
      *(long *)((long)&__return_storage_ptr__->field_2 + 8) = lVar3;
    }
    else {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)*plVar6;
      (__return_storage_ptr__->field_2)._M_allocated_capacity = *psVar8;
    }
    __return_storage_ptr__->_M_string_length = plVar6[1];
    *plVar6 = (long)psVar8;
    plVar6[1] = 0;
    *(undefined1 *)(plVar6 + 2) = 0;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_130._M_dataplus._M_p != paVar1) {
      operator_delete(local_130._M_dataplus._M_p);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0);
    }
    if (local_d0 != &local_c0) {
      operator_delete(local_d0);
    }
    if (local_f0 != &local_e0) {
      operator_delete(local_f0);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p);
    }
    iVar4 = std::__cxx11::string::compare((char *)&local_110);
    if (iVar4 == 0) {
      std::__cxx11::string::append((char *)__return_storage_ptr__);
    }
    else {
      std::operator+(&local_130,"\n",&local_110);
      std::__cxx11::string::_M_append
                ((char *)__return_storage_ptr__,(ulong)local_130._M_dataplus._M_p);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_130._M_dataplus._M_p != paVar1) {
        operator_delete(local_130._M_dataplus._M_p);
      }
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_110._M_dataplus._M_p != &local_110.field_2) {
    operator_delete(local_110._M_dataplus._M_p);
  }
  return __return_storage_ptr__;
}

Assistant:

string argParserAdvancedConfiguration::getAdditionalHelpFor(string command){

    argument * arg = getArgument(command);
    if(arg == nullptr)
        return "no such command \"" + command +"\"";

    string help = arg->additionalHelp;
    string out = "\n additional help for \"" + command + "\" \n\t <" +  arg->argShort+ ">  <" +
            arg->argLong + ">  \t" + arg->helpMessage;
    if(help != "")
        out += "\n" + help;
    else
        out += "\n\t no additional help available";
    return out;
}